

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

bool __thiscall
iDynTree::KinDynComputations::getWorldBaseTransform
          (KinDynComputations *this,MatrixView<double> *world_T_base)

{
  index_type iVar1;
  MatrixView<double> *in_RSI;
  bool bVar2;
  bool ok;
  int expected_transform_rows;
  int expected_transform_cols;
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffef8;
  MatrixView<double> *this_00;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 uVar3;
  MatrixView<double> *in_stack_ffffffffffffff48;
  
  this_00 = in_RSI;
  iVar1 = MatrixView<double>::rows(in_RSI);
  uVar3 = false;
  if (iVar1 == 4) {
    iVar1 = MatrixView<double>::cols(in_RSI);
    uVar3 = iVar1 == 4;
  }
  bVar2 = (bool)uVar3 != false;
  if (bVar2) {
    iDynTree::FreeFloatingPos::worldBasePos();
    iDynTree::Transform::asHomogeneousTransform();
    toEigen<4u,4u>((MatrixFixSize<4U,_4U> *)CONCAT17(uVar3,in_stack_ffffffffffffff18));
    toEigen(in_stack_ffffffffffffff48);
    Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<-1,-1>>::operator=
              ((Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_> *)this_00,
               in_stack_fffffffffffffef8);
  }
  else {
    iDynTree::reportError
              ("KinDynComputations","getWorldBaseTransform","Wrong size in input world_T_base");
  }
  return bVar2;
}

Assistant:

bool KinDynComputations::getWorldBaseTransform(iDynTree::MatrixView<double> world_T_base) const
{
    constexpr int expected_transform_cols = 4;
    constexpr int expected_transform_rows = 4;
    bool ok = (world_T_base.rows() == expected_transform_rows) && (world_T_base.cols() == expected_transform_cols);
    if( !ok )
    {
        reportError("KinDynComputations","getWorldBaseTransform","Wrong size in input world_T_base");
        return false;
    }

    toEigen(world_T_base) = toEigen(this->pimpl->m_pos.worldBasePos().asHomogeneousTransform());

    return true;
}